

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt16::read
          (PLYValueBigUInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  short sVar2;
  
  sVar2 = std::streambuf::sbumpc();
  this->value = sVar2 << 8;
  bVar1 = std::streambuf::sbumpc();
  this->value = this->value | (ushort)bVar1;
  return (ulong)bVar1;
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<unsigned short>((in->sbumpc()&0xff)<<8);
      value|=static_cast<unsigned short>(in->sbumpc()&0xff);
    }